

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bake.c
# Opt level: O0

err_t bakeBMQVRunA(octet *key,bign_params *params,bake_settings *settings,octet *privkeya,
                  bake_cert *certa,bake_cert *certb,read_i read,write_i write,void *file)

{
  bool_t bVar1;
  void *state_00;
  octet *in_00;
  octet *state_01;
  octet *key_00;
  uint uVar2;
  void *in_RCX;
  int *in_RDX;
  ulong *in_RSI;
  void *in_RDI;
  bign_params *in_R8;
  bake_settings *in_R9;
  octet *unaff_retaddr;
  code *in_stack_00000008;
  void *state;
  octet *out;
  octet *in;
  blob_t blob;
  size_t len;
  err_t code;
  size_t in_stack_ffffffffffffff88;
  bake_cert *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  err_t eVar3;
  
  bVar1 = memIsValid(in_RDI,0x20);
  if (bVar1 == 0) {
    eVar3 = 0x6d;
  }
  else if (((*in_RSI == 0x80) || (*in_RSI == 0xc0)) || (*in_RSI == 0x100)) {
    state_00 = (void *)(*in_RSI + 8);
    bakeBMQV_keep((size_t)state_00);
    in_00 = (octet *)blobCreate(in_stack_ffffffffffffff88);
    if (in_00 == (octet *)0x0) {
      eVar3 = 0x6e;
    }
    else {
      state_01 = in_00 + (*in_RSI >> 1);
      key_00 = state_01 + (*in_RSI >> 1) + 8;
      eVar3 = bakeBMQVStart(in_RCX,in_R8,in_R9,
                            (octet *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                            in_stack_ffffffffffffffb8);
      if (eVar3 == 0) {
        eVar3 = (*in_stack_00000008)(&stack0xffffffffffffffb8,in_00,*in_RSI >> 1,out);
        if (eVar3 == 0) {
          eVar3 = bakeBMQVStep3((octet *)in_stack_00000008,unaff_retaddr,
                                (bake_cert *)
                                CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI
                               );
          if (eVar3 == 0) {
            uVar2 = 0;
            if (*in_RDX != 0) {
              uVar2 = 8;
            }
            eVar3 = (*(code *)state)(&stack0xffffffffffffffb8,state_01,(*in_RSI >> 1) + (ulong)uVar2
                                     ,out);
            if (eVar3 == 0) {
              if (in_RDX[1] != 0) {
                eVar3 = (*in_stack_00000008)(&stack0xffffffffffffffb8,in_00,8,out);
                if (eVar3 != 0) {
                  blobClose((blob_t)0x12e74e);
                  return eVar3;
                }
                eVar3 = bakeBMQVStep5(in_00,state_01);
                if (eVar3 != 0) {
                  blobClose((blob_t)0x12e77c);
                  return eVar3;
                }
              }
              eVar3 = bakeBMQVStepG(key_00,state_00);
              blobClose((blob_t)0x12e7a5);
            }
            else {
              blobClose((blob_t)0x12e700);
            }
          }
          else {
            blobClose((blob_t)0x12e69c);
          }
        }
        else {
          blobClose((blob_t)0x12e661);
        }
      }
      else {
        blobClose((blob_t)0x12e618);
      }
    }
  }
  else {
    eVar3 = 0x1f6;
  }
  return eVar3;
}

Assistant:

err_t bakeBMQVRunA(octet key[32], const bign_params* params,
	const bake_settings* settings, const octet privkeya[],
	const bake_cert* certa, const bake_cert* certb,
	read_i read, write_i write, void* file)
{
	err_t code;
	size_t len;
	// блоб
	blob_t blob;
	octet* in;			/* [l / 2] */
	octet* out;			/* [l / 2 + 8] */
	void* state;		/* [bakeBMQV_keep()] */
	// проверить key
	if (!memIsValid(key, 32))
		return ERR_BAD_INPUT;
	// создать блоб
	if (params->l != 128 && params->l != 192 && params->l != 256)
		return ERR_BAD_PARAMS;
	blob = blobCreate(params->l + 8 + bakeBMQV_keep(params->l));
	if (blob == 0)
		return ERR_OUTOFMEMORY;
	// раскладка блоба
	in = (octet*)blob;
	out = in + params->l / 2;
	state = out + params->l / 2 + 8;
	// старт
	code = bakeBMQVStart(state, params, settings, privkeya, certa);
	ERR_CALL_HANDLE(code, blobClose(blob));
	// шаг 3
	code = read(&len, in, params->l / 2, file);
	ERR_CALL_HANDLE(code, blobClose(blob));
	code = bakeBMQVStep3(out, in, certb, state);
	ERR_CALL_HANDLE(code, blobClose(blob));
	code = write(&len, out, params->l / 2 + (settings->kca ? 8u : 0), file);
	ERR_CALL_HANDLE(code, blobClose(blob));
	// шаг 5
	if (settings->kcb)
	{
		code = read(&len, in, 8, file);
		ERR_CALL_HANDLE(code, blobClose(blob));
		code = bakeBMQVStep5(in, state);
		ERR_CALL_HANDLE(code, blobClose(blob));
	}
	// завершение
	code = bakeBMQVStepG(key, state);
	blobClose(blob);
	return code;
}